

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setEnvironment(Triple *this,EnvironmentType Kind)

{
  ObjectFormatType OVar1;
  undefined1 auVar2 [16];
  ObjectFormatType OVar3;
  undefined8 uVar4;
  StringRef local_100;
  Twine local_f0;
  Twine local_d8;
  StringRef local_c0;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  undefined1 local_68 [48];
  StringRef local_38;
  EnvironmentType local_24;
  Triple *pTStack_20;
  EnvironmentType Kind_local;
  Triple *this_local;
  undefined1 *local_10;
  
  OVar1 = this->ObjectFormat;
  local_24 = Kind;
  pTStack_20 = this;
  OVar3 = getDefaultFormat(this);
  if (OVar1 == OVar3) {
    local_38 = getEnvironmentTypeName(local_24);
    setEnvironmentName(this,local_38);
  }
  else {
    local_c0 = getEnvironmentTypeName(local_24);
    Twine::Twine(&local_b0,&local_c0);
    Twine::Twine(&local_d8,"-");
    llvm::operator+(&local_98,&local_b0,&local_d8);
    local_100 = getObjectFormatTypeName(this->ObjectFormat);
    Twine::Twine(&local_f0,&local_100);
    llvm::operator+(&local_80,&local_98,&local_f0);
    Twine::str_abi_cxx11_((Twine *)local_68);
    local_10 = local_68 + 0x20;
    this_local = (Triple *)local_68;
    uVar4 = std::__cxx11::string::data();
    auVar2 = local_68._32_16_;
    local_68._32_4_ = (ArchType)uVar4;
    local_68._36_4_ = SUB84(uVar4,4);
    local_68._32_16_ = auVar2;
    uVar4 = std::__cxx11::string::length();
    auVar2 = local_68._32_16_;
    local_68._40_4_ = (VendorType)uVar4;
    local_68._44_4_ = SUB84(uVar4,4);
    local_68._32_16_ = auVar2;
    setEnvironmentName(this,(StringRef)local_68._32_16_);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void Triple::setEnvironment(EnvironmentType Kind) {
  if (ObjectFormat == getDefaultFormat(*this))
    return setEnvironmentName(getEnvironmentTypeName(Kind));

  setEnvironmentName((getEnvironmentTypeName(Kind) + Twine("-") +
                      getObjectFormatTypeName(ObjectFormat)).str());
}